

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall
Liby::Connection::sendFile(Connection *this,fdPtr *fp,off_t off,off_t len,BasicHandler *handler)

{
  bool bVar1;
  undefined1 local_70 [16];
  io_task task;
  BasicHandler *handler_local;
  off_t len_local;
  off_t off_local;
  fdPtr *fp_local;
  Connection *this_local;
  
  task.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
          )handler;
  io_task::io_task((io_task *)(local_70 + 8));
  std::shared_ptr<Liby::FileDescriptor>::operator=
            ((shared_ptr<Liby::FileDescriptor> *)(local_70 + 8),fp);
  task.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)off;
  task.offset_ = len;
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)
                     task.handler_._M_t.
                     super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                     .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl);
  if (bVar1) {
    std::make_unique<std::function<void()>,std::function<void()>const&>
              ((function<void_()> *)local_70);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    operator=((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
              &task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ,(unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
               local_70);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )local_70);
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)(local_70 + 8));
  enableWrit(this,true);
  io_task::~io_task((io_task *)(local_70 + 8));
  return;
}

Assistant:

void Connection::sendFile(const fdPtr &fp, off_t off, off_t len,
                          const BasicHandler &handler) {
    io_task task;
    task.fp_ = fp;
    task.offset_ = off;
    task.len_ = len;
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}